

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.cpp
# Opt level: O3

void moveBits(uint8_t *buffer,int oldBitOffset,int newBitOffset,int len)

{
  bool bVar1;
  int iVar2;
  uint value;
  uint *buff;
  uint *puVar3;
  uint uVar4;
  BitStreamWriter writer;
  BitStreamReader reader;
  BitStreamWriter local_70;
  BitStreamReader local_50;
  
  buff = (uint *)(buffer + (oldBitOffset >> 3));
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  iVar2 = len + 7;
  if (-1 < len) {
    iVar2 = len;
  }
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer
            (&local_50.super_BitStream,(uint8_t *)buff,(byte *)((long)buff + (long)(iVar2 >> 3) + 1)
            );
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  local_70.super_BitStream.m_totalBits = 0;
  local_70.super_BitStream.m_buffer = (uint *)0x0;
  local_70.super_BitStream.m_initBuffer = (uint *)0x0;
  local_70.m_curVal = 0;
  local_70.m_bitWrited = 0;
  BitStream::setBuffer
            (&local_70.super_BitStream,buffer + (newBitOffset >> 3),
             buffer + (newBitOffset >> 3) + (long)(iVar2 >> 3) + 1);
  local_70.m_curVal = 0;
  local_70.m_bitWrited = 0;
  BitStreamWriter::skipBits(&local_70,newBitOffset % 8);
  uVar4 = oldBitOffset % 8;
  if (uVar4 != 0) {
    BitStreamReader::skipBits(&local_50,uVar4);
    uVar4 = 8 - uVar4;
    value = BitStreamReader::getBits(&local_50,uVar4);
    BitStreamWriter::putBits(&local_70,uVar4,value);
    len = len - uVar4;
    buff = (uint *)((long)buff + 1);
  }
  if ((7 < len) && (((ulong)buff & 3) != 0)) {
    uVar4 = len;
    puVar3 = buff;
    do {
      puVar3 = (uint *)((long)puVar3 + 1);
      BitStreamWriter::putBits(&local_70,8,(uint)(byte)*buff);
      buff = (uint *)((long)buff + 1);
      len = uVar4 - 8;
      if (uVar4 < 0x10) break;
      uVar4 = len;
    } while (((ulong)puVar3 & 3) != 0);
  }
  if (0x1f < len) {
    uVar4 = len;
    do {
      BitStreamWriter::putBits(&local_70,0x20,*buff);
      buff = buff + 1;
      len = uVar4 - 0x20;
      bVar1 = 0x3f < uVar4;
      uVar4 = len;
    } while (bVar1);
  }
  local_50.super_BitStream.m_totalBits = 0x20;
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.super_BitStream.m_buffer = buff;
  local_50.super_BitStream.m_initBuffer = buff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,buff);
  local_50.m_bitLeft = 0x20;
  uVar4 = BitStreamReader::getBits(&local_50,len);
  BitStreamWriter::putBits(&local_70,len,uVar4);
  BitStreamWriter::flushBits(&local_70);
  return;
}

Assistant:

void moveBits(uint8_t* buffer, const int oldBitOffset, const int newBitOffset, int len)
{
    uint8_t* src = buffer + (oldBitOffset >> 3);
    BitStreamReader reader{};
    reader.setBuffer(src, src + len / 8 + 1);
    uint8_t* dst = buffer + (newBitOffset >> 3);
    BitStreamWriter writer{};
    writer.setBuffer(dst, dst + len / 8 + 1);
    writer.skipBits(newBitOffset % 8);
    if (oldBitOffset % 8)
    {
        reader.skipBits(oldBitOffset % 8);
        const int c = 8 - (oldBitOffset % 8);
        writer.putBits(c, reader.getBits(c));
        len -= c;
        src++;
    }
    for (; len >= 8 && (reinterpret_cast<std::uintptr_t>(src) % sizeof(unsigned)) != 0; len -= 8)
    {
        writer.putBits(8, *src);
        src++;
    }

    for (; len >= static_cast<int>(INT_BIT); len -= INT_BIT)
    {
        writer.putBits(INT_BIT, *reinterpret_cast<unsigned*>(src));
        src += sizeof(unsigned);
    }
    reader.setBuffer(src, src + sizeof(unsigned));
    writer.putBits(len, reader.getBits(len));
    writer.flushBits();
}